

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::lastDiceHistoricalResolvedValues(Dice *this)

{
  ostream *poVar1;
  pointer pmVar2;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar3;
  _Base_ptr p_Var4;
  pointer pmVar5;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Dice container values for player ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->playerNumber);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  pmVar2 = (this->historyOfResolvedRolls).
           super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar5 = pmVar2 + -1;
  while ((this->it)._M_current = pmVar5, pmVar5 != pmVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    pmVar3 = (this->it)._M_current;
    p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
      poVar1 = std::operator<<((ostream *)&std::cout,this->DiceNames[p_Var4[1]._M_color]);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)&p_Var4[1].field_0x4);
      std::endl<char,std::char_traits<char>>(poVar1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pmVar3 = (this->it)._M_current;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    pmVar2 = (this->historyOfResolvedRolls).
             super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar5 = (this->it)._M_current + 1;
  }
  return;
}

Assistant:

void Dice::lastDiceHistoricalResolvedValues()
{
    cout << "Dice container values for player "<< this->getPlayerNumber() << endl;
    cout << "-----------------------------------------------------------------" << endl;
    for (it = historyOfResolvedRolls.end()-1; it != historyOfResolvedRolls.end(); ++it) {
        cout << "-----------------------------------------------------------------" << endl;

        for (auto mapIt(it->begin()); mapIt != it->end(); ++mapIt) {

            std::cout << DiceNames[mapIt->first] << ", " << mapIt->second << std::endl;
        }
        cout << "-----------------------------------------------------------------" << endl;

    }

}